

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

uint16_t bitset_container_maximum(bitset_container_t *container)

{
  ulong uVar1;
  long lVar2;
  short sVar3;
  uint uVar4;
  
  sVar3 = 1;
  uVar4 = 0x3ff;
  while( true ) {
    if (uVar4 == 0) {
      return 0;
    }
    uVar1 = container->words[uVar4];
    if (uVar1 != 0) break;
    sVar3 = sVar3 + 0x40;
    uVar4 = uVar4 - 1;
  }
  lVar2 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  return -(sVar3 + ((ushort)lVar2 ^ 0x3f));
}

Assistant:

uint16_t bitset_container_maximum(const bitset_container_t *container) {
  for (int32_t i = BITSET_CONTAINER_SIZE_IN_WORDS - 1; i > 0; --i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_leading_zeroes(w);
      return i * 64 + 63  - r;
    }
  }
  return 0;
}